

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chest.cpp
# Opt level: O1

void Handlers::Chest_Open(Character *character,PacketReader *reader)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar3;
  byte x;
  byte y;
  uint uVar4;
  uint uVar5;
  TileSpec TVar6;
  long *plVar7;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *plVar8;
  pointer psVar9;
  PacketBuilder reply;
  PacketBuilder local_60;
  
  x = PacketReader::GetChar(reader);
  y = PacketReader::GetChar(reader);
  uVar4 = (uint)character->x - (uint)x;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar5 = (uint)character->y - (uint)y;
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  if ((uVar4 & 0xff) + (uVar3 & 0xff) < 2) {
    TVar6 = Map::GetSpec(character->map,x,y);
    if (TVar6 == Chest) {
      PacketBuilder::PacketBuilder(&local_60,PACKET_CHEST,PACKET_OPEN,2);
      PacketBuilder::AddChar(&local_60,(uint)x);
      PacketBuilder::AddChar(&local_60,(uint)y);
      psVar9 = (character->map->chests).
               super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (character->map->chests).
               super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (psVar9 == psVar1) goto LAB_0015a990;
        peVar2 = (psVar9->super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this = (psVar9->super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        if ((peVar2->x == x) && (peVar2->y == y)) break;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        psVar9 = psVar9 + 1;
      }
      PacketBuilder::ReserveMore
                (&local_60,
                 (peVar2->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>.
                 _M_impl._M_node._M_size * 5);
      plVar8 = &peVar2->items;
      plVar7 = (long *)(plVar8->super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>).
                       _M_impl._M_node.super__List_node_base._M_next;
      if ((list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)plVar7 != plVar8) {
        do {
          if ((short)plVar7[2] != 0) {
            PacketBuilder::AddShort(&local_60,(int)(short)plVar7[2]);
            PacketBuilder::AddThree(&local_60,*(int *)((long)plVar7 + 0x14));
          }
          plVar7 = (long *)*plVar7;
        } while ((list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)plVar7 != plVar8);
      }
      Character::Send(character,&local_60);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
LAB_0015a990:
      PacketBuilder::~PacketBuilder(&local_60);
    }
  }
  return;
}

Assistant:

void Chest_Open(Character *character, PacketReader &reader)
{
	int x = reader.GetChar();
	int y = reader.GetChar();

	if (util::path_length(character->x, character->y, x, y) <= 1)
	{
		if (character->map->GetSpec(x, y) == Map_Tile::Chest)
		{
			PacketBuilder reply(PACKET_CHEST, PACKET_OPEN, 2);
			reply.AddChar(x);
			reply.AddChar(y);

			UTIL_FOREACH(character->map->chests, chest)
			{
				if (chest->x == x && chest->y == y)
				{
					reply.ReserveMore(chest->items.size() * 5);

					UTIL_CIFOREACH(chest->items, item)
					{
						if (item->id != 0)
						{
							reply.AddShort(item->id);
							reply.AddThree(item->amount);
						}
					}

					character->Send(reply);
					break;
				}
			}
		}
	}
}